

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_7::CreateArenaString
          (anon_unknown_7 *this,Arena *arena,string_view s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  TaggedStringPtr TVar2;
  void *extraout_RAX;
  undefined8 extraout_RAX_00;
  anon_unknown_7 *this_00;
  ulong extraout_RDX;
  Arena *arena_00;
  ulong *puVar3;
  ulong uVar4;
  string *unaff_R12;
  TaggedStringPtr TVar5;
  string_view s_00;
  ArenaStringPtr aAStack_58 [2];
  undefined1 local_28 [16];
  Arena *local_18;
  __atomic_base<long> local_10;
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> local_8;
  
  local_10._M_i = s._M_len;
  puVar3 = (ulong *)local_28;
  arena_00 = (Arena *)local_28;
  this_00 = (anon_unknown_7 *)&local_18;
  local_28._0_8_ = this;
  local_18 = arena;
  local_8._M_b._M_p = (__base_type)(__base_type)this;
  pbVar1 = absl::lts_20240722::utility_internal::
           IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string,char_const*,unsigned_long>(google::protobuf::Arena*,char_const*&&,unsigned_long&&)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string,char_const*,unsigned_long>(google::protobuf::Arena*,char_const*&&,unsigned_long&&)::_lambda((auto:1&&)___)_2_,char_const*,unsigned_long>
                     ((anon_class_8_1_a7a63227 *)local_28,(anon_class_8_1_a7a63227 *)&local_8,
                      (char **)&local_10,(unsigned_long *)this_00);
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    _GLOBAL__N_1::CreateArenaString((_GLOBAL__N_1 *)local_28);
  }
  else {
    puVar3 = (ulong *)((ulong)pbVar1 & 3);
    if (puVar3 == (ulong *)0x0) {
      return (void *)((ulong)pbVar1 | 3);
    }
  }
  _GLOBAL__N_1::CreateArenaString();
  uVar4 = *puVar3;
  if ((uVar4 & 3) != 0) {
    if ((uVar4 & 2) == 0) {
      ArenaStringPtr::Set(aAStack_58);
    }
    else {
      uVar4 = uVar4 & 0xfffffffffffffffc;
      if (uVar4 != 0) {
        TVar2.ptr_ = (void *)std::__cxx11::string::_M_replace
                                       (uVar4,0,*(char **)(uVar4 + 8),extraout_RDX);
        return (TaggedStringPtr)TVar2.ptr_;
      }
    }
    ArenaStringPtr::Set(aAStack_58);
LAB_001cb7fb:
    ArenaStringPtr::Set();
    operator_delete(unaff_R12,0x20);
    _Unwind_Resume(extraout_RAX_00);
  }
  if (this_00 == (anon_unknown_7 *)0x0) {
    unaff_R12 = (string *)operator_new(0x20);
    *(string **)unaff_R12 = unaff_R12 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (unaff_R12,extraout_RDX,(long)&(arena_00->impl_).tag_and_id_ + extraout_RDX);
    if (((ulong)unaff_R12 & 3) != 0) goto LAB_001cb7fb;
    TVar5.ptr_ = (void *)((ulong)unaff_R12 | 2);
    TVar2.ptr_ = extraout_RAX;
  }
  else {
    s_00._M_str = (char *)this_00;
    s_00._M_len = extraout_RDX;
    TVar2 = CreateArenaString(this_00,arena_00,s_00);
    TVar5 = TVar2;
  }
  *puVar3 = (ulong)TVar5.ptr_;
  return (TaggedStringPtr)TVar2.ptr_;
}

Assistant:

TaggedStringPtr CreateArenaString(Arena& arena, absl::string_view s) {
  TaggedStringPtr res;
  res.SetMutableArena(Arena::Create<std::string>(&arena, s.data(), s.length()));
  return res;
}